

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_benchmarker.hpp
# Opt level: O2

vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_> * __thiscall
hayai::Benchmarker::GetTests
          (vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
           *__return_storage_ptr__,Benchmarker *this)

{
  pointer ppTVar1;
  value_type *__x;
  long lVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0xffffffffffffffff;
  lVar2 = 0;
  while( true ) {
    ppTVar1 = (this->_tests).
              super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar3 = uVar3 + 1;
    if ((ulong)((long)(this->_tests).
                      super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar3)
    break;
    __x = (value_type *)((long)ppTVar1 + lVar2);
    lVar2 = lVar2 + 8;
    inja::std::vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>::push_back
              (__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestDescriptor*> GetTests() const
        {
            std::vector<TestDescriptor*> tests;

            std::size_t index = 0;
            while (index < _tests.size())
                tests.push_back(_tests[index++]);

            return tests;
        }